

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,XMLSize_t hostLen,int port,XMLCh *userinfo,XMLSize_t userLen)

{
  XMLCh theChar;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar1 = isWellFormedAddress(host,hostLen);
  bVar5 = false;
  if (((port + 1U < 0x10001) && (bVar5 = false, bVar1)) && (bVar5 = userLen == 0, !bVar5)) {
    uVar4 = 0;
    do {
      theChar = userinfo[uVar4];
      bVar5 = XMLString::isAlphaNum(theChar);
      lVar3 = 1;
      if (((!bVar5) && (iVar2 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar2 == -1))
         && (iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,userinfo[uVar4]), iVar2 == -1))
      {
        if (((userinfo[uVar4] != L'%') || (userLen <= uVar4 + 2)) ||
           (bVar5 = XMLString::isHex(userinfo[uVar4 + 1]), !bVar5)) {
          return false;
        }
        bVar5 = XMLString::isHex(userinfo[uVar4 + 2]);
        lVar3 = 3;
        if (!bVar5) {
          return false;
        }
      }
      uVar4 = uVar4 + lVar3;
      bVar5 = uVar4 >= userLen;
    } while (uVar4 < userLen);
  }
  return bVar5;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host,
                                         const XMLSize_t hostLen,
                                         const int port,
                                         const XMLCh* const userinfo,
                                         const XMLSize_t userLen)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, hostLen))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    XMLSize_t index = 0;
    while (index < userLen)
    {
        if (isUnreservedCharacter(userinfo[index]) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, userinfo[index]) != -1))
        {
            index++;
        }
        else if (userinfo[index] == chPercent)               // '%'
        {
            if (index + 2 < userLen
                && XMLString::isHex(userinfo[index+1])       // 1st hex
                && XMLString::isHex(userinfo[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}